

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_session_load(mbedtls_ssl_session *session,uchar *buf,size_t len)

{
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  mbedtls_x509_crt *crt;
  uchar *buf_00;
  ulong buflen;
  
  if (session == (mbedtls_ssl_session *)0x0) {
    iVar8 = -0x6c00;
    goto LAB_001a2cac;
  }
  if (4 < len) {
    iVar8 = -0x5f00;
    if (buf[4] != ssl_serialized_session_header[4] ||
        *(int *)buf != ssl_serialized_session_header._0_4_) goto LAB_001a2cac;
    if (((len != 5) && (bVar1 = buf[5], session->tls_version = bVar1 + 0x300, bVar1 == 3)) &&
       (0x56 < len - 6)) {
      session->ciphersuite = (uint)(ushort)(*(ushort *)(buf + 6) << 8 | *(ushort *)(buf + 6) >> 8);
      session->id_len = (ulong)buf[8];
      uVar3 = *(undefined8 *)(buf + 9);
      uVar4 = *(undefined8 *)(buf + 0x11);
      uVar5 = *(undefined8 *)(buf + 0x21);
      *(undefined8 *)(session->id + 0x10) = *(undefined8 *)(buf + 0x19);
      *(undefined8 *)(session->id + 0x18) = uVar5;
      *(undefined8 *)session->id = uVar3;
      *(undefined8 *)(session->id + 8) = uVar4;
      uVar3 = *(undefined8 *)(buf + 0x31);
      uVar4 = *(undefined8 *)(buf + 0x39);
      uVar5 = *(undefined8 *)(buf + 0x41);
      uVar6 = *(undefined8 *)(buf + 0x49);
      uVar7 = *(undefined8 *)(buf + 0x51);
      *(undefined8 *)session->master = *(undefined8 *)(buf + 0x29);
      *(undefined8 *)(session->master + 8) = uVar3;
      *(undefined8 *)(session->master + 0x10) = uVar4;
      *(undefined8 *)(session->master + 0x18) = uVar5;
      *(undefined8 *)(session->master + 0x20) = uVar6;
      *(undefined8 *)(session->master + 0x28) = uVar7;
      uVar2 = *(uint *)(buf + 0x59);
      session->verify_result =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      session->peer_cert = (mbedtls_x509_crt *)0x0;
      if (2 < len - 0x5d) {
        buf_00 = buf + 0x60;
        buflen = (ulong)buf[0x5f] | (ulong)((uint)buf[0x5e] << 8 | (uint)buf[0x5d] << 0x10);
        if (buflen != 0) {
          if (len - 0x60 < buflen) goto LAB_001a2c7b;
          crt = (mbedtls_x509_crt *)calloc(1,0x2f0);
          session->peer_cert = crt;
          if (crt == (mbedtls_x509_crt *)0x0) {
            iVar8 = -0x7f00;
            goto LAB_001a2cac;
          }
          mbedtls_x509_crt_init(crt);
          iVar8 = mbedtls_x509_crt_parse_der(session->peer_cert,buf_00,buflen);
          if (iVar8 != 0) {
            mbedtls_x509_crt_free(session->peer_cert);
            free(session->peer_cert);
            session->peer_cert = (mbedtls_x509_crt *)0x0;
            goto LAB_001a2cac;
          }
          buf_00 = buf_00 + buflen;
        }
        if (buf + len != buf_00) {
          session->mfl_code = *buf_00;
          iVar8 = -0x7100;
          if (buf_00 + 1 == buf + len) {
            return 0;
          }
          goto LAB_001a2cac;
        }
      }
    }
  }
LAB_001a2c7b:
  iVar8 = -0x7100;
LAB_001a2cac:
  mbedtls_ssl_session_free(session);
  return iVar8;
}

Assistant:

int mbedtls_ssl_session_load(mbedtls_ssl_session *session,
                             const unsigned char *buf,
                             size_t len)
{
    int ret = ssl_session_load(session, 0, buf, len);

    if (ret != 0) {
        mbedtls_ssl_session_free(session);
    }

    return ret;
}